

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O3

void __thiscall
boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>::on
          (reporter<boost::ext::ut::v1_1_8::printer> *this,test_end param_1)

{
  undefined1 *puVar1;
  size_t *psVar2;
  char *pcVar3;
  char local_1b [3];
  
  puVar1 = &(this->printer_).field_0x40;
  if (this->fails_ < (this->asserts_).fail) {
    psVar2 = &(this->tests_).fail;
    *psVar2 = *psVar2 + 1;
    local_1b[0] = '\n';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,local_1b,1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)puVar1,(this->printer_).colors_.fail._M_str,
               (this->printer_).colors_.fail._M_len);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"FAILED",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)puVar1,(this->printer_).colors_.none._M_str,
               (this->printer_).colors_.none._M_len);
    pcVar3 = local_1b + 1;
    local_1b[1] = 10;
  }
  else {
    (this->tests_).pass = (this->tests_).pass + 1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)puVar1,(this->printer_).colors_.pass._M_str,
               (this->printer_).colors_.pass._M_len);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"PASSED",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)puVar1,(this->printer_).colors_.none._M_str,
               (this->printer_).colors_.none._M_len);
    pcVar3 = local_1b + 2;
    local_1b[2] = 10;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,pcVar3,1);
  return;
}

Assistant:

auto on(events::test_end) -> void {
      if (asserts_.fail > fails_) {
        ++tests_.fail;
        printer_ << '\n'
                 << printer_.colors().fail << "FAILED" << printer_.colors().none
                 << '\n';
      } else {
        ++tests_.pass;
        printer_ << printer_.colors().pass << "PASSED" << printer_.colors().none
                 << '\n';
      }
    }